

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::PatchableProperty
          (ByteCodeWriter *this,OpCode op,RegSlot value,RegSlot instance,uint cacheId,bool isCtor,
          bool registerCacheIdForCall)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  RegSlot instance_00;
  undefined4 *puVar5;
  FunctionBody *pFVar6;
  Phase phase;
  undefined3 in_register_00000089;
  CacheIdUnit local_50;
  CacheIdUnit unit;
  Type local_3a;
  RegSlot local_38;
  ProfileId profileId;
  OpCode op_local;
  
  unit._5_3_ = in_register_00000089;
  unit.isRootObjectCache = isCtor;
  profileId = op;
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x34);
  bVar3 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x82b,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar3) goto LAB_00893660;
    *puVar5 = 0;
  }
  if (value != 0xffffffff) {
    pFVar6 = this->m_functionWrite;
    if (pFVar6 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar3) goto LAB_00893660;
      *puVar5 = 0;
      pFVar6 = this->m_functionWrite;
    }
    local_38 = FunctionBody::MapRegSlot(pFVar6,value);
    if (instance != 0xffffffff) {
      pFVar6 = this->m_functionWrite;
      if (pFVar6 == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
        if (!bVar3) goto LAB_00893660;
        *puVar5 = 0;
        pFVar6 = this->m_functionWrite;
      }
      instance_00 = FunctionBody::MapRegSlot(pFVar6,instance);
      local_3a = 0xffff;
      bVar3 = false;
      if (op < LdFldForCallApplyTarget) {
        if (op < LdFld) {
          if (((op == InitLetFld) || (op == InitConstFld)) || (op == InitClassMember))
          goto LAB_00893525;
        }
        else if (((op == LdFld) || (op == LdFld_ReuseLoc)) || (op == LdFldForTypeOf)) {
          if ((unit.isRootObjectCache & registerCacheIdForCall) == 1) {
            local_50._4_4_ = (uint)(uint3)local_50._5_3_ << 8;
            local_50.cacheId = cacheId;
            bVar3 = JsUtil::
                    BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    ::TryGetValue<unsigned_int>
                              (this->callRegToLdFldCacheIndexMap,&local_38,&local_50);
            if (bVar3) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              *puVar5 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                          ,0x84d,
                                          "(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit))"
                                          ,"!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit)"
                                         );
              if (!bVar3) goto LAB_00893660;
              *puVar5 = 0;
            }
            JsUtil::
            BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::
            Insert<(JsUtil::BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                      ((BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)this->callRegToLdFldCacheIndexMap,&local_38,&local_50);
          }
          goto LAB_0089331d;
        }
LAB_008935b5:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x873,"(false)",
                                    "The specified OpCode is not intended for patchable field-access"
                                   );
        if (!bVar3) goto LAB_00893660;
        *puVar5 = 0;
      }
      else if (op < StFldStrict) {
        if (op == LdFldForCallApplyTarget) {
LAB_0089331d:
          bVar3 = DynamicProfileInfo::IsEnabled(AggressiveIntTypeSpecPhase,this->m_functionWrite);
          if (((!bVar3) &&
              (bVar3 = DynamicProfileInfo::IsEnabled(FloatTypeSpecPhase,this->m_functionWrite),
              !bVar3)) &&
             ((bVar3 = DynamicProfileInfo::IsEnabled(ObjTypeSpecPhase,this->m_functionWrite), !bVar3
              && (bVar3 = DoDynamicProfileOpcode(this,InlinePhase,false), !bVar3)))) {
            pFVar6 = this->m_functionWrite;
            phase = ProfileBasedFldFastPathPhase;
            goto LAB_00893510;
          }
        }
        else {
          if (op == LdMethodFld) {
            if (registerCacheIdForCall) {
              local_50._4_4_ = (uint)(uint3)local_50._5_3_ << 8;
              local_50.cacheId = cacheId;
              bVar3 = JsUtil::
                      BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      ::TryGetValue<unsigned_int>
                                (this->callRegToLdFldCacheIndexMap,&local_38,&local_50);
              if (bVar3) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
                *puVar5 = 1;
                bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                            ,0x85f,
                                            "(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit))"
                                            ,
                                            "!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit)"
                                           );
                if (!bVar3) goto LAB_00893660;
                *puVar5 = 0;
              }
              JsUtil::
              BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::
              Insert<(JsUtil::BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                        ((BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)this->callRegToLdFldCacheIndexMap,&local_38,&local_50);
            }
          }
          else if (op != StFld) goto LAB_008935b5;
LAB_008934e2:
          bVar3 = DynamicProfileInfo::IsEnabled(ProfileBasedFldFastPathPhase,this->m_functionWrite);
          if ((!bVar3) && (bVar3 = DoDynamicProfileOpcode(this,InlinePhase,false), !bVar3)) {
            pFVar6 = this->m_functionWrite;
            phase = ObjTypeSpecPhase;
LAB_00893510:
            bVar3 = DynamicProfileInfo::IsEnabled(phase,pFVar6);
            if (!bVar3) goto LAB_00893522;
          }
        }
        OpCodeUtil::ConvertNonCallOpToProfiled(&profileId);
      }
      else {
        if (op < ScopedLdMethodFld) {
          if ((op == StFldStrict) || (op == InitFld)) goto LAB_008934e2;
          goto LAB_008935b5;
        }
        if (op == ScopedLdMethodFld) goto LAB_00893525;
        if (op != LdLen_A) goto LAB_008935b5;
        bVar3 = DynamicProfileInfo::IsEnabled(AggressiveIntTypeSpecPhase,this->m_functionWrite);
        if (((((bVar3) ||
              (bVar3 = DynamicProfileInfo::IsEnabled(FloatTypeSpecPhase,this->m_functionWrite),
              bVar3)) ||
             (bVar3 = DynamicProfileInfo::IsEnabled(TypedArrayTypeSpecPhase,this->m_functionWrite),
             bVar3)) ||
            ((bVar3 = DynamicProfileInfo::IsEnabled(ArrayCheckHoistPhase,this->m_functionWrite),
             bVar3 || (bVar3 = DynamicProfileInfo::IsEnabled(ObjTypeSpecPhase,this->m_functionWrite)
                      , bVar3)))) ||
           ((bVar3 = DoDynamicProfileOpcode(this,InlinePhase,false), bVar3 ||
            (bVar3 = DynamicProfileInfo::IsEnabled
                               (ProfileBasedFldFastPathPhase,this->m_functionWrite), bVar3)))) {
          TVar1 = this->m_functionWrite->profiledLdLenCount;
          if (TVar1 != 0xffff) {
            this->m_functionWrite->profiledLdLenCount = TVar1 + 1;
            local_3a = TVar1;
            OpCodeUtil::ConvertNonCallOpToProfiled(&profileId);
            bVar3 = true;
            goto LAB_00893525;
          }
        }
      }
LAB_00893522:
      bVar3 = false;
LAB_00893525:
      bVar4 = TryWriteElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                        (this,profileId,local_38,instance_00,cacheId);
      if ((!bVar4) &&
         (bVar4 = TryWriteElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                            (this,profileId,local_38,instance_00,cacheId), !bVar4)) {
        local_50.cacheId = local_38;
        local_50._4_4_ = instance_00;
        unit.cacheId = cacheId;
        Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,profileId,this);
        Data::Write(&this->m_byteCodeData,&local_50,0xc);
      }
      if (bVar3) {
        Data::Write(&this->m_byteCodeData,&local_3a,2);
      }
      return;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar5 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar3) {
    *puVar5 = 0;
    Throw::InternalError();
  }
LAB_00893660:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void ByteCodeWriter::PatchableProperty(OpCode op, RegSlot value, RegSlot instance, uint cacheId, bool isCtor, bool registerCacheIdForCall)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementCP);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);
        instance = ConsumeReg(instance);

        bool isProfiled = false;
        Js::ProfileId profileId = Js::Constants::NoProfileId;

        switch (op)
        {
        case OpCode::LdLen_A:
        {
            if ((DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) ||
                DoDynamicProfileOpcode(FloatTypeSpecPhase) ||
                DoDynamicProfileOpcode(TypedArrayTypeSpecPhase) ||
                DoDynamicProfileOpcode(ArrayCheckHoistPhase) ||
                DoDynamicProfileOpcode(ObjTypeSpecPhase) ||
                DoDynamicProfileOpcode(InlinePhase) ||
                DoDynamicProfileOpcode(ProfileBasedFldFastPathPhase))
                && this->m_functionWrite->AllocProfiledLdLenId(&profileId))
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
                isProfiled = true;
            }
            break;
        }
        case OpCode::LdFldForTypeOf:
        case OpCode::LdFld:
        case OpCode::LdFld_ReuseLoc:
            if (isCtor) // The symbol loaded by this LdFld will be used as a constructor
            {
                if (registerCacheIdForCall)
                {
                    CacheIdUnit unit(cacheId);
                    Assert(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit));
                    callRegToLdFldCacheIndexMap->Add(value, unit);
                }
            }
        case OpCode::LdFldForCallApplyTarget:
            if (DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) ||
                DoDynamicProfileOpcode(FloatTypeSpecPhase) ||
                DoDynamicProfileOpcode(ObjTypeSpecPhase) ||
                DoDynamicProfileOpcode(InlinePhase) ||
                DoDynamicProfileOpcode(ProfileBasedFldFastPathPhase))
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
            }
            break;
        case OpCode::LdMethodFld:
            if (registerCacheIdForCall)
            {
                CacheIdUnit unit(cacheId);
                Assert(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit));
                callRegToLdFldCacheIndexMap->Add(value, unit);
            }
            // fall-through
        case OpCode::StFld:
        case OpCode::StFldStrict:
        case OpCode::InitFld:
            if (DoDynamicProfileOpcode(ProfileBasedFldFastPathPhase) ||
                DoDynamicProfileOpcode(InlinePhase) ||
                DoDynamicProfileOpcode(ObjTypeSpecPhase))
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
            }
            break;
        case OpCode::InitLetFld:
        case OpCode::InitConstFld:
        case OpCode::InitClassMember:
        case OpCode::ScopedLdMethodFld:
            break;
        default:
            AssertMsg(false, "The specified OpCode is not intended for patchable field-access");
            break;
        }

        MULTISIZE_LAYOUT_WRITE(ElementCP, op, value, instance, cacheId);

        if (isProfiled)
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
        }
    }